

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Square::run(Nes_Square *this,nes_time_t time,nes_time_t end_time)

{
  int iVar1;
  nes_time_t nVar2;
  uint uVar3;
  int timer_period_00;
  int in_EDX;
  int in_ESI;
  Blip_Synth<12,_1> *in_RDI;
  int phase;
  int delta_1;
  Synth *synth;
  Blip_Buffer *output;
  int delta;
  int amp;
  int duty;
  int duty_select;
  int volume;
  int offset;
  int timer_period;
  int period;
  int in_stack_ffffffffffffffa8;
  blip_time_t in_stack_ffffffffffffffac;
  uint local_48;
  int local_44;
  uint local_2c;
  uint local_28;
  int local_1c;
  int local_c;
  
  iVar1 = Nes_Osc::period((Nes_Osc *)in_RDI);
  timer_period_00 = (iVar1 + 1) * 2;
  if (*(Blip_Buffer **)&(in_RDI->impl).last_amp == (Blip_Buffer *)0x0) {
    nVar2 = maintain_phase((Nes_Square *)in_RDI,
                           in_ESI + *(int *)((long)&(in_RDI->impl).volume_unit_ + 4),in_EDX,
                           timer_period_00);
    *(nes_time_t *)((long)&(in_RDI->impl).volume_unit_ + 4) = nVar2 - in_EDX;
  }
  else {
    Blip_Buffer::set_modified(*(Blip_Buffer **)&(in_RDI->impl).last_amp);
    local_1c = iVar1 >> (((Nes_Osc *)&(in_RDI->impl).buf)->regs[1] & 7);
    if ((((Nes_Osc *)&(in_RDI->impl).buf)->regs[1] & 8) != 0) {
      local_1c = 0;
    }
    uVar3 = Nes_Envelope::volume((Nes_Envelope *)in_RDI);
    if (((uVar3 == 0) || (iVar1 < 8)) || (0x7ff < iVar1 + local_1c)) {
      if (*(int *)&(in_RDI->impl).impulses != 0) {
        Blip_Synth<12,_1>::offset
                  (in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (Blip_Buffer *)0x987ea6);
        *(undefined4 *)&(in_RDI->impl).impulses = 0;
      }
      local_c = maintain_phase((Nes_Square *)in_RDI,
                               *(int *)((long)&(in_RDI->impl).volume_unit_ + 4) + in_ESI,in_EDX,
                               timer_period_00);
    }
    else {
      iVar1 = (int)(uint)*(byte *)&(in_RDI->impl).buf >> 6;
      local_28 = 1 << (sbyte)iVar1;
      local_2c = 0;
      if (iVar1 == 3) {
        local_28 = 2;
        local_2c = uVar3;
      }
      if (*(int *)in_RDI->impulses < (int)local_28) {
        local_2c = uVar3 ^ local_2c;
      }
      iVar1 = Nes_Osc::update_amp((Nes_Osc *)in_RDI,local_2c);
      if (iVar1 != 0) {
        Blip_Synth<12,_1>::offset
                  (in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (Blip_Buffer *)0x987f69);
      }
      local_c = *(int *)((long)&(in_RDI->impl).volume_unit_ + 4) + in_ESI;
      if (local_c < in_EDX) {
        local_44 = local_2c * 2 - uVar3;
        local_48 = *(uint *)in_RDI->impulses;
        do {
          local_48 = local_48 + 1 & 7;
          if ((local_48 == 0) || (local_48 == local_28)) {
            local_44 = -local_44;
            Blip_Synth<12,_1>::offset_inline
                      (in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                       (Blip_Buffer *)0x987ff3);
          }
          local_c = timer_period_00 + local_c;
        } while (local_c < in_EDX);
        *(int *)&(in_RDI->impl).impulses = (int)(local_44 + uVar3) >> 1;
        *(uint *)in_RDI->impulses = local_48;
      }
    }
    *(int *)((long)&(in_RDI->impl).volume_unit_ + 4) = local_c - in_EDX;
  }
  return;
}

Assistant:

void Nes_Square::run( nes_time_t time, nes_time_t end_time )
{
	const int period = this->period();
	const int timer_period = (period + 1) * 2;
	
	if ( !output )
	{
		delay = maintain_phase( time + delay, end_time, timer_period ) - end_time;
		return;
	}
	
	output->set_modified();
	
	int offset = period >> (regs [1] & shift_mask);
	if ( regs [1] & negate_flag )
		offset = 0;
	
	const int volume = this->volume();
	if ( volume == 0 || period < 8 || (period + offset) >= 0x800 )
	{
		if ( last_amp ) {
			synth.offset( time, -last_amp, output );
			last_amp = 0;
		}
		
		time += delay;
		time = maintain_phase( time, end_time, timer_period );
	}
	else
	{
		// handle duty select
		int duty_select = (regs [0] >> 6) & 3;
		int duty = 1 << duty_select; // 1, 2, 4, 2
		int amp = 0;
		if ( duty_select == 3 ) {
			duty = 2; // negated 25%
			amp = volume;
		}
		if ( phase < duty )
			amp ^= volume;
		
		{
			int delta = update_amp( amp );
			if ( delta )
				synth.offset( time, delta, output );
		}
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			const Synth& synth = this->synth;
			int delta = amp * 2 - volume;
			int phase = this->phase;
			
			do {
				phase = (phase + 1) & (phase_range - 1);
				if ( phase == 0 || phase == duty ) {
					delta = -delta;
					synth.offset_inline( time, delta, output );
				}
				time += timer_period;
			}
			while ( time < end_time );
			
			last_amp = (delta + volume) >> 1;
			this->phase = phase;
		}
	}
	
	delay = time - end_time;
}